

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O3

void __thiscall Emulator::run(Emulator *this,uint sleep_time)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  timespec local_38;
  
  this->running = true;
  do {
    update_keys(this);
    run_instruction(this);
    update_timers(this);
    update_screen(this);
    uVar1 = (ulong)sleep_time / 1000000;
    lVar2 = ((ulong)sleep_time % 1000000) * 1000;
    if (sleep_time != 0) {
      do {
        local_38.tv_nsec = lVar2;
        local_38.tv_sec = uVar1;
        iVar3 = nanosleep(&local_38,&local_38);
        if (iVar3 != -1) break;
        piVar4 = __errno_location();
        uVar1 = local_38.tv_sec;
        lVar2 = local_38.tv_nsec;
      } while (*piVar4 == 4);
    }
    if (this->running == false) {
      return;
    }
  } while( true );
}

Assistant:

void Emulator::run(uint sleep_time){
	running = true;

	// Main loop. Each cycle we update keys state, run a single instruction,
	// update timers and update the screen.
	while (running){
		update_keys();
		run_instruction();
		update_timers();
		update_screen();
		std::this_thread::sleep_for(std::chrono::microseconds(sleep_time));
	}
}